

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O2

XMLCh * __thiscall
PSVIWriterHandlers::translateOrderedFacet(PSVIWriterHandlers *this,ORDERING ordered)

{
  if (ordered < (ORDERED_TOTAL|ORDERED_PARTIAL)) {
    return (XMLCh *)(&PTR_fgFalse_0011d228)[ordered];
  }
  return (XMLCh *)&xercesc_4_0::PSVIUni::fgUnknown;
}

Assistant:

const XMLCh* PSVIWriterHandlers::translateOrderedFacet(XSSimpleTypeDefinition::ORDERING ordered) {
	switch (ordered) {
		case XSSimpleTypeDefinition::ORDERED_FALSE:
			return PSVIUni::fgFalse;
		case XSSimpleTypeDefinition::ORDERED_PARTIAL:
			return PSVIUni::fgPartial;
		case XSSimpleTypeDefinition::ORDERED_TOTAL:
			return PSVIUni::fgTotal;
		default :
			return PSVIUni::fgUnknown;
	}
}